

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

bool __thiscall QPDF::findStartxref(QPDF *this)

{
  InputSource *this_00;
  bool bVar1;
  qpdf_offset_t qVar2;
  allocator<char> local_101;
  string local_100;
  Token local_e0;
  Token local_78;
  
  readToken(&local_e0,this,
            (((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"startxref",&local_101);
  bVar1 = QPDFTokenizer::Token::isWord(&local_e0,&local_100);
  if (bVar1) {
    readToken(&local_78,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    bVar1 = local_78.type == tt_integer;
    QPDFTokenizer::Token::~Token(&local_78);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_100);
  QPDFTokenizer::Token::~Token(&local_e0);
  if (bVar1 != false) {
    this_00 = (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar2 = InputSource::getLastOffset(this_00);
    (*this_00->_vptr_InputSource[5])(this_00,qVar2,0);
  }
  return bVar1;
}

Assistant:

bool
QPDF::findStartxref()
{
    if (readToken(*m->file).isWord("startxref") && readToken(*m->file).isInteger()) {
        // Position in front of offset token
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}